

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O1

void Cof_ManPrintHighFanout(Cof_Man_t *p,int nNodes)

{
  int iVar1;
  void **ppvVar2;
  Vec_Ptr_t *__ptr;
  long lVar3;
  
  __ptr = Cof_ManCollectHighFanout(p,nNodes);
  iVar1 = __ptr->nSize;
  if (0 < (long)iVar1) {
    ppvVar2 = __ptr->pArray;
    lVar3 = 0;
    do {
      Cof_ManPrintHighFanoutOne(p,(Cof_Obj_t *)ppvVar2[lVar3]);
      lVar3 = lVar3 + 1;
    } while (iVar1 != lVar3);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void Cof_ManPrintHighFanout( Cof_Man_t * p, int nNodes )
{
    Vec_Ptr_t * vNodes;
    Cof_Obj_t * pObj;
    int i;
    vNodes = Cof_ManCollectHighFanout( p, nNodes );
    Vec_PtrForEachEntry( Cof_Obj_t *, vNodes, pObj, i )
        Cof_ManPrintHighFanoutOne( p, pObj );
    Vec_PtrFree( vNodes );
}